

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operators.hpp
# Opt level: O3

string * __thiscall
viennamath::op_binary<viennamath::op_mult<double>,viennamath::rt_expression_interface<double>>::
str_abi_cxx11_(op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>
               *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  *(undefined2 *)&in_RDI->field_2 = 0x2a;
  in_RDI->_M_string_length = 1;
  return in_RDI;
}

Assistant:

std::string str() const { return BinaryOperation::str(); }